

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

clip_ctx * clip_init(char *fname,clip_context_params ctx_params)

{
  clip_ctx *this;
  clip_context_params ctx_params_local;
  clip_model_loader loader;
  
  g_logger_state.verbosity_thold = ctx_params.verbosity;
  ctx_params_local = ctx_params;
  this = (clip_ctx *)operator_new(0x3b0);
  clip_ctx::clip_ctx(this,&ctx_params_local);
  clip_model_loader::clip_model_loader(&loader,fname,this);
  clip_model_loader::load_hparams(&loader);
  clip_model_loader::load_tensors(&loader);
  clip_model_loader::alloc_compute_meta(&loader);
  clip_model_loader::~clip_model_loader(&loader);
  return this;
}

Assistant:

struct clip_ctx * clip_init(const char * fname, struct clip_context_params ctx_params) {
    g_logger_state.verbosity_thold = ctx_params.verbosity;
    clip_ctx * ctx_clip = new clip_ctx(ctx_params);

    try {
        clip_model_loader loader(fname, *ctx_clip);
        loader.load_hparams();
        loader.load_tensors();
        loader.alloc_compute_meta();
    } catch (const std::exception & e) {
        LOG_ERR("%s: failed to load model '%s': %s\n", __func__, fname, e.what());
        delete ctx_clip;
        return nullptr;
    }

    return ctx_clip;
}